

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::SerialArena::AllocateAlignedFallback(SerialArena *this,size_t n)

{
  LogMessage *pLVar1;
  LogMessage local_38;
  Voidify local_22;
  undefined1 local_21;
  void *pvStack_20;
  bool res;
  void *ret;
  size_t n_local;
  SerialArena *this_local;
  
  ret = (void *)n;
  n_local = (size_t)this;
  AllocateNewBlock(this,n);
  pvStack_20 = (void *)0x0;
  local_21 = MaybeAllocateAligned(this,(size_t)ret,&stack0xffffffffffffffe0);
  if (((local_21 ^ 0xff) & 1) == 0) {
    return pvStack_20;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
             ,0x10c,"res");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_22,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

PROTOBUF_NOINLINE
void* SerialArena::AllocateAlignedFallback(size_t n) {
  AllocateNewBlock(n);
  void* ret = nullptr;
  bool res = MaybeAllocateAligned(n, &ret);
  ABSL_DCHECK(res);
  return ret;
}